

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_node_metric_solb(REF_GRID ref_grid,FILE *file)

{
  undefined4 uVar1;
  long lVar2;
  REF_GLOB value;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  double local_230;
  int local_228;
  int local_220;
  int local_21c;
  int local_218;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_LONG ref_private_status_reis_bi_18;
  REF_LONG ref_private_status_reis_ai_18;
  REF_LONG ref_private_status_reis_bi_17;
  REF_LONG ref_private_status_reis_ai_17;
  REF_LONG ref_private_status_reis_bi_16;
  REF_LONG ref_private_status_reis_ai_16;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rxs;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int local_a0;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT fp_size;
  REF_INT int_size;
  REF_INT nmetric;
  REF_INT dim;
  REF_INT version;
  REF_INT code;
  REF_INT header_size;
  REF_INT keyword_code;
  REF_FILEPOS next_position;
  int local_70;
  REF_STATUS status;
  REF_INT im;
  REF_INT i;
  REF_INT n;
  REF_INT local;
  REF_GLOB first;
  REF_GLOB nnode_written;
  REF_GLOB global;
  REF_DBL *xyzm;
  REF_DBL *local_xyzm;
  REF_MPI pRStack_30;
  REF_INT chunk;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  FILE *file_local;
  REF_GRID ref_grid_local;
  
  ref_mpi = (REF_MPI)ref_grid->node;
  pRStack_30 = ref_grid->mpi;
  _header_size = 0;
  ref_node = (REF_NODE)file;
  file_local = (FILE *)ref_grid;
  uVar4 = ref_node_synchronize_globals((REF_NODE)ref_mpi);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x586,
           "ref_gather_node_metric_solb",(ulong)uVar4,"sync");
    return uVar4;
  }
  int_size = 3;
  fp_size = 6;
  if (*(int *)&file_local[1]._IO_write_end != 0) {
    int_size = 2;
    fp_size = 3;
  }
  nmetric = 2;
  if (*(int *)file_local->_unused2 < 2) {
    lVar2._0_4_ = ref_mpi[1].timing;
    lVar2._4_4_ = ref_mpi[1].reduce_byte_limit;
    if (10000000 < lVar2) {
      nmetric = 3;
    }
    lVar6._0_4_ = ref_mpi[1].timing;
    lVar6._4_4_ = ref_mpi[1].reduce_byte_limit;
    if (200000000 < lVar6) {
      nmetric = 4;
    }
  }
  else {
    nmetric = *(REF_INT *)file_local->_unused2;
  }
  ref_private_macro_code_rss = 4;
  local_a0 = 4;
  if (2 < nmetric) {
    local_a0 = 8;
  }
  if (3 < nmetric) {
    ref_private_macro_code_rss = 8;
  }
  version = local_a0 + 4 + ref_private_macro_code_rss;
  if (pRStack_30->id == 0) {
    dim = 1;
    sVar5 = fwrite(&dim,4,1,(FILE *)ref_node);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x59f,"ref_gather_node_metric_solb","code",1,sVar5);
      return 1;
    }
    sVar5 = fwrite(&nmetric,4,1,(FILE *)ref_node);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5a0,"ref_gather_node_metric_solb","version",1,sVar5);
      return 1;
    }
    _header_size = ftell((FILE *)ref_node);
    _header_size = (local_a0 + 8) + _header_size;
    code = 3;
    sVar5 = fwrite(&code,4,1,(FILE *)ref_node);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5a3,"ref_gather_node_metric_solb","dim code",1,sVar5);
      return 1;
    }
    uVar4 = ref_export_meshb_next_position((FILE *)ref_node,nmetric,_header_size);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5a4,"ref_gather_node_metric_solb",(ulong)uVar4,"next p");
      return uVar4;
    }
    sVar5 = fwrite(&int_size,4,1,(FILE *)ref_node);
    lVar2 = _header_size;
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5a5,"ref_gather_node_metric_solb","dim",1,sVar5);
      return 1;
    }
    lVar6 = ftell((FILE *)ref_node);
    if (lVar2 != lVar6) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5a6,"ref_gather_node_metric_solb","dim inconsistent",lVar2,lVar6);
      return 1;
    }
  }
  if (pRStack_30->id == 0) {
    lVar6 = (long)version;
    lVar2 = *(long *)&ref_mpi[1].timing;
    _header_size = ftell((FILE *)ref_node);
    _header_size = lVar6 + 8 + lVar2 * (fp_size << 3) + _header_size;
    code = 0x3e;
    sVar5 = fwrite(&code,4,1,(FILE *)ref_node);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5af,"ref_gather_node_metric_solb","vertex version code",1,sVar5);
      return 1;
    }
    uVar4 = ref_export_meshb_next_position((FILE *)ref_node,nmetric,_header_size);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5b0,"ref_gather_node_metric_solb",(ulong)uVar4,"next p");
      return uVar4;
    }
    value._0_4_ = ref_mpi[1].timing;
    value._4_4_ = ref_mpi[1].reduce_byte_limit;
    uVar4 = ref_gather_meshb_glob((FILE *)ref_node,nmetric,value);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5b2,"ref_gather_node_metric_solb",(ulong)uVar4,"nnode");
      return uVar4;
    }
    code = 1;
    sVar5 = fwrite(&code,4,1,(FILE *)ref_node);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5b4,"ref_gather_node_metric_solb","n solutions",1,sVar5);
      return 1;
    }
    code = 3;
    sVar5 = fwrite(&code,4,1,(FILE *)ref_node);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5b6,"ref_gather_node_metric_solb","metric solution",1,sVar5);
      return 1;
    }
  }
  local_21c = (int)(*(long *)&ref_mpi[1].timing / (long)pRStack_30->n) + 1;
  if (pRStack_30->reduce_byte_limit < 1) {
    local_218 = 0x7fffffff;
  }
  else {
    local_218 = pRStack_30->reduce_byte_limit / 0x38;
  }
  if (local_218 <= local_21c) {
    if (pRStack_30->reduce_byte_limit < 1) {
      local_220 = 0x7fffffff;
    }
    else {
      local_220 = pRStack_30->reduce_byte_limit / 0x38;
    }
    local_21c = local_220;
  }
  local_xyzm._4_4_ = local_21c;
  if (local_21c * 7 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x5bd,
           "ref_gather_node_metric_solb","malloc local_xyzm of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    xyzm = (REF_DBL *)malloc((long)(local_21c * 7) << 3);
    if (xyzm == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5bd,"ref_gather_node_metric_solb","malloc local_xyzm of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else if (local_xyzm._4_4_ * 7 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5be,"ref_gather_node_metric_solb","malloc xyzm of REF_DBL negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      global = (REF_GLOB)malloc((long)(local_xyzm._4_4_ * 7) << 3);
      if ((void *)global == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x5be,"ref_gather_node_metric_solb","malloc xyzm of REF_DBL NULL");
        ref_grid_local._4_4_ = 2;
      }
      else {
        first = 0;
        while (lVar3._0_4_ = ref_mpi[1].timing, lVar3._4_4_ = ref_mpi[1].reduce_byte_limit,
              first < lVar3) {
          _n = first;
          if ((long)local_xyzm._4_4_ < *(long *)&ref_mpi[1].timing - first) {
            local_228 = local_xyzm._4_4_;
          }
          else {
            uVar1 = ref_mpi[1].timing;
            local_228 = uVar1 - (int)first;
          }
          im = local_228;
          first = local_228 + first;
          for (status = 0;
              SBORROW4(status,local_xyzm._4_4_ * 7) != status + local_xyzm._4_4_ * -7 < 0;
              status = status + 1) {
            xyzm[status] = 0.0;
          }
          for (status = 0; status < im; status = status + 1) {
            nnode_written = _n + status;
            uVar4 = ref_node_local((REF_NODE)ref_mpi,nnode_written,&i);
            next_position._4_4_ = uVar4;
            if ((uVar4 != 0) && (uVar4 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x5ce,"ref_gather_node_metric_solb",(ulong)uVar4,"node local failed");
              return uVar4;
            }
            if ((uVar4 == 0) &&
               (pRStack_30->id == *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)i * 4))) {
              uVar4 = ref_node_metric_get((REF_NODE)ref_mpi,i,xyzm + status * 7);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x5d1,"ref_gather_node_metric_solb",(ulong)uVar4,"get");
                return uVar4;
              }
              xyzm[status * 7 + 6] = 1.0;
            }
            else {
              for (local_70 = 0; local_70 < 7; local_70 = local_70 + 1) {
                xyzm[local_70 + status * 7] = 0.0;
              }
            }
          }
          uVar4 = ref_mpi_sum(pRStack_30,xyzm,(void *)global,im * 7,3);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x5d8,"ref_gather_node_metric_solb",(ulong)uVar4,"sum");
            return uVar4;
          }
          if (pRStack_30->id == 0) {
            for (status = 0; status < im; status = status + 1) {
              if (*(double *)(global + (long)(status * 7 + 6) * 8) - 1.0 <= 0.0) {
                local_230 = -(*(double *)(global + (long)(status * 7 + 6) * 8) - 1.0);
              }
              else {
                local_230 = *(double *)(global + (long)(status * 7 + 6) * 8) - 1.0;
              }
              if (0.1 < local_230) {
                printf("error gather node %ld %f\n",
                       *(undefined8 *)(global + (long)(status * 7 + 6) * 8),_n + status);
              }
              if (int_size == 3) {
                sVar5 = fwrite((void *)(global + (long)(status * 7) * 8),8,1,(FILE *)ref_node);
                if (sVar5 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5e1,"ref_gather_node_metric_solb","m11",1,sVar5);
                  return 1;
                }
                sVar5 = fwrite((void *)(global + (long)(status * 7 + 1) * 8),8,1,(FILE *)ref_node);
                if (sVar5 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5e2,"ref_gather_node_metric_solb","m12",1,sVar5);
                  return 1;
                }
                sVar5 = fwrite((void *)(global + (long)(status * 7 + 3) * 8),8,1,(FILE *)ref_node);
                if (sVar5 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5e4,"ref_gather_node_metric_solb","m22",1,sVar5);
                  return 1;
                }
                sVar5 = fwrite((void *)(global + (long)(status * 7 + 2) * 8),8,1,(FILE *)ref_node);
                if (sVar5 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5e5,"ref_gather_node_metric_solb","m13",1,sVar5);
                  return 1;
                }
                sVar5 = fwrite((void *)(global + (long)(status * 7 + 4) * 8),8,1,(FILE *)ref_node);
                if (sVar5 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5e6,"ref_gather_node_metric_solb","m23",1,sVar5);
                  return 1;
                }
                sVar5 = fwrite((void *)(global + (long)(status * 7 + 5) * 8),8,1,(FILE *)ref_node);
                if (sVar5 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5e7,"ref_gather_node_metric_solb","m33",1,sVar5);
                  return 1;
                }
              }
              else {
                sVar5 = fwrite((void *)(global + (long)(status * 7) * 8),8,1,(FILE *)ref_node);
                if (sVar5 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5e9,"ref_gather_node_metric_solb","m11",1,sVar5);
                  return 1;
                }
                sVar5 = fwrite((void *)(global + (long)(status * 7 + 1) * 8),8,1,(FILE *)ref_node);
                if (sVar5 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5ea,"ref_gather_node_metric_solb","m12",1,sVar5);
                  return 1;
                }
                sVar5 = fwrite((void *)(global + (long)(status * 7 + 3) * 8),8,1,(FILE *)ref_node);
                if (sVar5 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5eb,"ref_gather_node_metric_solb","m22",1,sVar5);
                  return 1;
                }
              }
            }
          }
        }
        if (global != 0) {
          free((void *)global);
        }
        if (xyzm != (REF_DBL *)0x0) {
          free(xyzm);
        }
        lVar2 = _header_size;
        if ((pRStack_30->id == 0) && (lVar6 = ftell((FILE *)ref_node), lVar2 != lVar6)) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x5f4,"ref_gather_node_metric_solb","solb metric record len inconsistent",lVar2,
                 lVar6);
          ref_grid_local._4_4_ = 1;
        }
        else {
          if (pRStack_30->id == 0) {
            code = 0x36;
            sVar5 = fwrite(&code,4,1,(FILE *)ref_node);
            if (sVar5 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x5f8,"ref_gather_node_metric_solb","end kw",1,sVar5);
              return 1;
            }
            _header_size = 0;
            uVar4 = ref_export_meshb_next_position((FILE *)ref_node,nmetric,0);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x5fa,"ref_gather_node_metric_solb",(ulong)uVar4,"next p");
              return uVar4;
            }
          }
          ref_grid_local._4_4_ = 0;
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_metric_solb(REF_GRID ref_grid,
                                                      FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im;
  REF_STATUS status;
  REF_FILEPOS next_position = 0;
  REF_INT keyword_code, header_size;
  REF_INT code, version, dim, nmetric;
  REF_INT int_size, fp_size;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  dim = 3;
  nmetric = 6;
  if (ref_grid_twod(ref_grid)) {
    dim = 2;
    nmetric = 3;
  }

  version = 2;
  if (1 < ref_grid_meshb_version(ref_grid)) {
    version = ref_grid_meshb_version(ref_grid);
  } else {
    if (REF_EXPORT_MESHB_VERTEX_3 < ref_node_n_global(ref_node)) version = 3;
    if (REF_EXPORT_MESHB_VERTEX_4 < ref_node_n_global(ref_node)) version = 4;
  }

  int_size = 4;
  fp_size = 4;
  if (2 < version) fp_size = 8;
  if (3 < version) int_size = 8;
  header_size = 4 + fp_size + int_size;

  if (ref_mpi_once(ref_mpi)) {
    code = 1;
    REIS(1, fwrite(&code, sizeof(int), 1, file), "code");
    REIS(1, fwrite(&version, sizeof(int), 1, file), "version");
    next_position = (REF_FILEPOS)(4 + fp_size + 4) + ftell(file);
    keyword_code = 3;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "dim code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    REIS(1, fwrite(&dim, sizeof(int), 1, file), "dim");
    REIS(next_position, ftell(file), "dim inconsistent");
  }

  if (ref_mpi_once(ref_mpi)) {
    next_position =
        (REF_FILEPOS)header_size + (REF_FILEPOS)(4 + 4) +
        (REF_FILEPOS)ref_node_n_global(ref_node) * (REF_FILEPOS)(nmetric * 8) +
        ftell(file);
    keyword_code = 62;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "vertex version code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    RSS(ref_gather_meshb_glob(file, version, ref_node_n_global(ref_node)),
        "nnode");
    keyword_code = 1; /* one solution at node */
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "n solutions");
    keyword_code = 3; /* solution type 3, metric */
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "metric solution");
  }

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(
      chunk, ref_mpi_reduce_chunk_limit(ref_mpi, 7 * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, 7 * chunk, REF_DBL);
  ref_malloc(xyzm, 7 * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;

    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < 7 * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        RSS(ref_node_metric_get(ref_node, local, &(local_xyzm[7 * i])), "get");
        local_xyzm[6 + 7 * i] = 1.0;
      } else {
        for (im = 0; im < 7; im++) local_xyzm[im + 7 * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, 7 * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[6 + 7 * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[6 + 7 * i]);
        }
        if (3 == dim) { /* threed */
          REIS(1, fwrite(&(xyzm[0 + 7 * i]), sizeof(REF_DBL), 1, file), "m11");
          REIS(1, fwrite(&(xyzm[1 + 7 * i]), sizeof(REF_DBL), 1, file), "m12");
          /* transposed 3,2 */
          REIS(1, fwrite(&(xyzm[3 + 7 * i]), sizeof(REF_DBL), 1, file), "m22");
          REIS(1, fwrite(&(xyzm[2 + 7 * i]), sizeof(REF_DBL), 1, file), "m13");
          REIS(1, fwrite(&(xyzm[4 + 7 * i]), sizeof(REF_DBL), 1, file), "m23");
          REIS(1, fwrite(&(xyzm[5 + 7 * i]), sizeof(REF_DBL), 1, file), "m33");
        } else { /* twod */
          REIS(1, fwrite(&(xyzm[0 + 7 * i]), sizeof(REF_DBL), 1, file), "m11");
          REIS(1, fwrite(&(xyzm[1 + 7 * i]), sizeof(REF_DBL), 1, file), "m12");
          REIS(1, fwrite(&(xyzm[3 + 7 * i]), sizeof(REF_DBL), 1, file), "m22");
        }
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  if (ref_mpi_once(ref_mpi))
    REIS(next_position, ftell(file), "solb metric record len inconsistent");

  if (ref_mpi_once(ref_mpi)) { /* End */
    keyword_code = 54;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "end kw");
    next_position = 0;
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
  }

  return REF_SUCCESS;
}